

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cc
# Opt level: O0

void brotli::BuildAndStoreHuffmanTreeFast
               (uint32_t *histogram,size_t histogram_total,size_t max_bits,uint8_t *depth,
               uint16_t *bits,size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  ulong uVar2;
  size_t sVar3;
  uint32_t count_00;
  byte *pbVar4;
  bool bVar5;
  ulong local_108;
  size_t k_1;
  size_t reps;
  ulong uStack_f0;
  uint8_t value;
  size_t i_3;
  ulong uStack_e0;
  uint8_t previous_value;
  size_t j_1;
  size_t i_2;
  int right;
  int left;
  int k;
  int j;
  int i;
  HuffmanTree sentinel;
  int n;
  HuffmanTree local_a8;
  size_t local_a0;
  size_t i_1;
  HuffmanTree *node;
  HuffmanTree *pHStack_88;
  uint32_t count_limit;
  HuffmanTree *tree;
  size_t max_tree_size;
  size_t total;
  size_t length;
  size_t symbols [4];
  ulong local_40;
  size_t count;
  size_t *storage_ix_local;
  uint16_t *bits_local;
  uint8_t *depth_local;
  size_t max_bits_local;
  size_t histogram_total_local;
  uint32_t *histogram_local;
  
  local_40 = 0;
  memset(&length,0,0x20);
  total = 0;
  max_tree_size = histogram_total;
  while (max_tree_size != 0) {
    if (histogram[total] != 0) {
      if (local_40 < 4) {
        symbols[local_40 - 1] = total;
      }
      local_40 = local_40 + 1;
      max_tree_size = max_tree_size - histogram[total];
    }
    total = total + 1;
  }
  if (local_40 < 2) {
    WriteBits(4,1,storage_ix,storage);
    WriteBits(max_bits,length,storage_ix,storage);
  }
  else {
    tree = (HuffmanTree *)(total * 2 + 1);
    pHStack_88 = (HuffmanTree *)malloc((long)tree * 8);
    node._4_4_ = 1;
    while( true ) {
      i_1 = (size_t)pHStack_88;
      local_a0 = total;
      while (local_a0 != 0) {
        local_a0 = local_a0 - 1;
        if (histogram[local_a0] != 0) {
          if (histogram[local_a0] < node._4_4_) {
            HuffmanTree::HuffmanTree
                      ((HuffmanTree *)&sentinel.index_left_,node._4_4_,-1,(int16_t)local_a0);
            *(undefined8 *)i_1 = stack0xffffffffffffff50;
          }
          else {
            HuffmanTree::HuffmanTree(&local_a8,histogram[local_a0],-1,(int16_t)local_a0);
            *(HuffmanTree *)i_1 = local_a8;
          }
          i_1 = i_1 + 8;
        }
      }
      sentinel.total_count_ = (uint32_t)((long)(i_1 - (long)pHStack_88) >> 3);
      std::sort<brotli::HuffmanTree*,bool(*)(brotli::HuffmanTree_const&,brotli::HuffmanTree_const&)>
                (pHStack_88,(HuffmanTree *)i_1,SortHuffmanTree);
      count_00 = std::numeric_limits<int>::max();
      HuffmanTree::HuffmanTree((HuffmanTree *)&j,count_00,-1,-1);
      *(HuffmanTree *)i_1 = _j;
      *(HuffmanTree *)(i_1 + 8) = _j;
      k = 0;
      left = sentinel.total_count_ + 1;
      i_1 = i_1 + 0x10;
      right = sentinel.total_count_;
      while (right = right - 1, 0 < right) {
        if (pHStack_88[left].total_count_ < pHStack_88[k].total_count_) {
          i_2._4_4_ = left;
          left = left + 1;
        }
        else {
          i_2._4_4_ = k;
          k = k + 1;
        }
        if (pHStack_88[left].total_count_ < pHStack_88[k].total_count_) {
          i_2._0_4_ = left;
          left = left + 1;
        }
        else {
          i_2._0_4_ = k;
          k = k + 1;
        }
        *(uint32_t *)(i_1 - 8) =
             pHStack_88[i_2._4_4_].total_count_ + pHStack_88[(int)i_2].total_count_;
        *(short *)(i_1 - 4) = (short)i_2._4_4_;
        *(short *)(i_1 - 2) = (short)(int)i_2;
        *(HuffmanTree *)i_1 = _j;
        i_1 = i_1 + 8;
      }
      SetDepth(pHStack_88 + (int)(sentinel.total_count_ * 2 + -1),pHStack_88,depth,'\0');
      pbVar4 = std::max_element<unsigned_char*>(depth,depth + total);
      if (*pbVar4 < 0xf) break;
      node._4_4_ = node._4_4_ << 1;
    }
    free(pHStack_88);
    ConvertBitDepthsToSymbols(depth,total,bits);
    if (local_40 < 5) {
      WriteBits(2,1,storage_ix,storage);
      WriteBits(2,local_40 - 1,storage_ix,storage);
      for (j_1 = 0; sVar3 = j_1, j_1 < local_40; j_1 = j_1 + 1) {
        while (uVar2 = sVar3, uStack_e0 = uVar2 + 1, uStack_e0 < local_40) {
          sVar3 = uStack_e0;
          if (depth[symbols[uVar2]] < depth[symbols[j_1 - 1]]) {
            std::swap<unsigned_long>(symbols + uVar2,symbols + (j_1 - 1));
            sVar3 = uStack_e0;
          }
        }
      }
      if (local_40 == 2) {
        WriteBits(max_bits,length,storage_ix,storage);
        WriteBits(max_bits,symbols[0],storage_ix,storage);
      }
      else if (local_40 == 3) {
        WriteBits(max_bits,length,storage_ix,storage);
        WriteBits(max_bits,symbols[0],storage_ix,storage);
        WriteBits(max_bits,symbols[1],storage_ix,storage);
      }
      else {
        WriteBits(max_bits,length,storage_ix,storage);
        WriteBits(max_bits,symbols[0],storage_ix,storage);
        WriteBits(max_bits,symbols[1],storage_ix,storage);
        WriteBits(max_bits,symbols[2],storage_ix,storage);
        WriteBits(1,(long)(int)(uint)(depth[length] == '\x01'),storage_ix,storage);
      }
    }
    else {
      StoreStaticCodeLengthCode(storage_ix,storage);
      i_3._7_1_ = 8;
      uStack_f0 = 0;
      while (uStack_f0 < total) {
        bVar1 = depth[uStack_f0];
        k_1 = 1;
        local_108 = uStack_f0;
        while( true ) {
          local_108 = local_108 + 1;
          bVar5 = false;
          if (local_108 < total) {
            bVar5 = depth[local_108] == bVar1;
          }
          if (!bVar5) break;
          k_1 = k_1 + 1;
        }
        uStack_f0 = k_1 + uStack_f0;
        if (bVar1 == 0) {
          WriteBits((ulong)*(uint *)(kZeroRepsDepth + k_1 * 4),
                    *(uint64_t *)(kZeroRepsBits + k_1 * 8),storage_ix,storage);
        }
        else {
          if (i_3._7_1_ != bVar1) {
            WriteBits((ulong)(byte)kCodeLengthDepth[bVar1],
                      (ulong)*(uint *)(kCodeLengthBits + (ulong)bVar1 * 4),storage_ix,storage);
            k_1 = k_1 - 1;
          }
          i_3._7_1_ = bVar1;
          if (k_1 < 3) {
            while (k_1 != 0) {
              k_1 = k_1 - 1;
              WriteBits((ulong)(byte)kCodeLengthDepth[bVar1],
                        (ulong)*(uint *)(kCodeLengthBits + (ulong)bVar1 * 4),storage_ix,storage);
            }
          }
          else {
            WriteBits((ulong)*(uint *)(kNonZeroRepsDepth + (k_1 - 3) * 4),
                      *(uint64_t *)(kNonZeroRepsBits + (k_1 - 3) * 8),storage_ix,storage);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void BuildAndStoreHuffmanTreeFast(const uint32_t *histogram,
                                  const size_t histogram_total,
                                  const size_t max_bits,
                                  uint8_t* depth,
                                  uint16_t* bits,
                                  size_t* storage_ix,
                                  uint8_t* storage) {
  size_t count = 0;
  size_t symbols[4] = { 0 };
  size_t length = 0;
  size_t total = histogram_total;
  while (total != 0) {
    if (histogram[length]) {
      if (count < 4) {
        symbols[count] = length;
      }
      ++count;
      total -= histogram[length];
    }
    ++length;
  }

  if (count <= 1) {
    WriteBits(4, 1, storage_ix, storage);
    WriteBits(max_bits, symbols[0], storage_ix, storage);
    return;
  }

  const size_t max_tree_size = 2 * length + 1;
  HuffmanTree* const tree =
      static_cast<HuffmanTree*>(malloc(max_tree_size * sizeof(HuffmanTree)));
  for (uint32_t count_limit = 1; ; count_limit *= 2) {
    HuffmanTree* node = tree;
    for (size_t i = length; i != 0;) {
      --i;
      if (histogram[i]) {
        if (PREDICT_TRUE(histogram[i] >= count_limit)) {
          *node = HuffmanTree(histogram[i], -1, static_cast<int16_t>(i));
        } else {
          *node = HuffmanTree(count_limit, -1, static_cast<int16_t>(i));
        }
        ++node;
      }
    }
    const int n = static_cast<int>(node - tree);
    std::sort(tree, node, SortHuffmanTree);
    // The nodes are:
    // [0, n): the sorted leaf nodes that we start with.
    // [n]: we add a sentinel here.
    // [n + 1, 2n): new parent nodes are added here, starting from
    //              (n+1). These are naturally in ascending order.
    // [2n]: we add a sentinel at the end as well.
    // There will be (2n+1) elements at the end.
    const HuffmanTree sentinel(std::numeric_limits<int>::max(), -1, -1);
    *node++ = sentinel;
    *node++ = sentinel;

    int i = 0;      // Points to the next leaf node.
    int j = n + 1;  // Points to the next non-leaf node.
    for (int k = n - 1; k > 0; --k) {
      int left, right;
      if (tree[i].total_count_ <= tree[j].total_count_) {
        left = i;
        ++i;
      } else {
        left = j;
        ++j;
      }
      if (tree[i].total_count_ <= tree[j].total_count_) {
        right = i;
        ++i;
      } else {
        right = j;
        ++j;
      }
      // The sentinel node becomes the parent node.
      node[-1].total_count_ =
          tree[left].total_count_ + tree[right].total_count_;
      node[-1].index_left_ = static_cast<int16_t>(left);
      node[-1].index_right_or_value_ = static_cast<int16_t>(right);
      // Add back the last sentinel node.
      *node++ = sentinel;
    }
    SetDepth(tree[2 * n - 1], &tree[0], depth, 0);
    // We need to pack the Huffman tree in 14 bits.
    // If this was not successful, add fake entities to the lowest values
    // and retry.
    if (PREDICT_TRUE(*std::max_element(&depth[0], &depth[length]) <= 14)) {
      break;
    }
  }
  free(tree);
  ConvertBitDepthsToSymbols(depth, length, bits);
  if (count <= 4) {
    // value of 1 indicates a simple Huffman code
    WriteBits(2, 1, storage_ix, storage);
    WriteBits(2, count - 1, storage_ix, storage);  // NSYM - 1

    // Sort
    for (size_t i = 0; i < count; i++) {
      for (size_t j = i + 1; j < count; j++) {
        if (depth[symbols[j]] < depth[symbols[i]]) {
          std::swap(symbols[j], symbols[i]);
        }
      }
    }

    if (count == 2) {
      WriteBits(max_bits, symbols[0], storage_ix, storage);
      WriteBits(max_bits, symbols[1], storage_ix, storage);
    } else if (count == 3) {
      WriteBits(max_bits, symbols[0], storage_ix, storage);
      WriteBits(max_bits, symbols[1], storage_ix, storage);
      WriteBits(max_bits, symbols[2], storage_ix, storage);
    } else {
      WriteBits(max_bits, symbols[0], storage_ix, storage);
      WriteBits(max_bits, symbols[1], storage_ix, storage);
      WriteBits(max_bits, symbols[2], storage_ix, storage);
      WriteBits(max_bits, symbols[3], storage_ix, storage);
      // tree-select
      WriteBits(1, depth[symbols[0]] == 1 ? 1 : 0, storage_ix, storage);
    }
  } else {
    // Complex Huffman Tree
    StoreStaticCodeLengthCode(storage_ix, storage);

    // Actual rle coding.
    uint8_t previous_value = 8;
    for (size_t i = 0; i < length;) {
      const uint8_t value = depth[i];
      size_t reps = 1;
      for (size_t k = i + 1; k < length && depth[k] == value; ++k) {
        ++reps;
      }
      i += reps;
      if (value == 0) {
        WriteBits(kZeroRepsDepth[reps], kZeroRepsBits[reps],
                  storage_ix, storage);
      } else {
        if (previous_value != value) {
          WriteBits(kCodeLengthDepth[value], kCodeLengthBits[value],
                    storage_ix, storage);
          --reps;
        }
        if (reps < 3) {
          while (reps != 0) {
            reps--;
            WriteBits(kCodeLengthDepth[value], kCodeLengthBits[value],
                      storage_ix, storage);
          }
        } else {
          reps -= 3;
          WriteBits(kNonZeroRepsDepth[reps], kNonZeroRepsBits[reps],
                    storage_ix, storage);
        }
        previous_value = value;
      }
    }
  }
}